

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O0

void S_ParseMusInfo(void)

{
  bool bVar1;
  FName *this;
  FName local_130;
  int local_12c;
  FName music;
  int index;
  level_info_t *map;
  undefined1 local_110 [8];
  FScanner sc;
  int lump;
  int lastlump;
  
  sc.CMode = false;
  sc.StateMode = '\0';
  sc.StateOptions = false;
  sc.Escape = false;
  while (sc.LastGotLine = FWadCollection::FindLump(&Wads,"MUSINFO",(int *)&sc.CMode,false),
        sc.LastGotLine != -1) {
    FScanner::FScanner((FScanner *)local_110,sc.LastGotLine);
    while (bVar1 = FScanner::GetString((FScanner *)local_110), bVar1) {
      _music = FindLevelInfo((char *)local_110,true);
      if (_music == (level_info_t *)0x0) {
        FScanner::ScriptMessage((FScanner *)local_110,"Unknown map \'%s\'",local_110);
      }
      while (bVar1 = FScanner::CheckNumber((FScanner *)local_110), bVar1) {
        local_12c = sc.StringLen;
        FScanner::MustGetString((FScanner *)local_110);
        if ((0 < local_12c) &&
           (FName::FName(&local_130,(char *)local_110), _music != (level_info_t *)0x0)) {
          this = TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_>::operator[]
                           (&_music->MusicMap,local_12c);
          FName::operator=(this,&local_130);
        }
      }
    }
    FScanner::~FScanner((FScanner *)local_110);
  }
  return;
}

Assistant:

void S_ParseMusInfo()
{
	int lastlump = 0, lump;

	while ((lump = Wads.FindLump ("MUSINFO", &lastlump)) != -1)
	{
		FScanner sc(lump);

		while (sc.GetString())
		{
			level_info_t *map = FindLevelInfo(sc.String);

			if (map == NULL)
			{
				// Don't abort for invalid maps
				sc.ScriptMessage("Unknown map '%s'", sc.String);
			}
			while (sc.CheckNumber())
			{
				int index = sc.Number;
				sc.MustGetString();
				if (index > 0)
				{
					FName music = sc.String;
					if (map != NULL)
					{
						map->MusicMap[index] = music;
					}
				}
			}
		}
	}
}